

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_slice.c
# Opt level: O0

RK_S32 h264e_slice_update(H264eSlice *slice,MppEncCfgSet *cfg,H264eSps *sps,H264ePps *pps,
                         H264eDpbFrm *frm)

{
  RK_U32 RVar1;
  ulong uVar2;
  RK_S32 RVar3;
  RK_U32 local_44;
  RK_S32 local_40;
  RK_S32 is_idr;
  MppEncH264Cfg *h264;
  H264eDpbFrm *frm_local;
  H264ePps *pps_local;
  H264eSps *sps_local;
  MppEncCfgSet *cfg_local;
  H264eSlice *slice_local;
  
  uVar2 = (frm->status).val >> 5;
  slice->mb_w = sps->pic_width_in_mbs;
  slice->mb_h = sps->pic_height_in_mbs;
  slice->max_num_ref_frames = sps->num_ref_frames;
  slice->log2_max_frame_num = sps->log2_max_frame_num_minus4 + 4;
  slice->log2_max_poc_lsb = sps->log2_max_poc_lsb_minus4 + 4;
  slice->entropy_coding_mode = (cfg->codec).field_1.h264.entropy_coding_mode;
  slice->pic_order_cnt_type = sps->pic_order_cnt_type;
  slice->qp_init = pps->pic_init_qp;
  if (((frm->status).val >> 6 & 1) == 0) {
    local_40 = 2;
    if ((uVar2 & 1) != 0) {
      local_40 = 3;
    }
  }
  else {
    local_40 = 0;
  }
  slice->nal_reference_idc = local_40;
  RVar3 = 1;
  if ((uVar2 & 1) != 0) {
    RVar3 = 5;
  }
  slice->nalu_type = RVar3;
  slice->first_mb_in_slice = 0;
  RVar1 = 0;
  if ((uVar2 & 1) != 0) {
    RVar1 = 2;
  }
  slice->slice_type = RVar1;
  slice->pic_parameter_set_id = 0;
  slice->frame_num = frm->frame_num;
  slice->num_ref_idx_override = 0;
  slice->qp_delta = 0;
  if ((cfg->codec).field_1.h264.entropy_coding_mode == 0) {
    local_44 = 0xffffffff;
  }
  else {
    local_44 = (cfg->codec).field_1.h264.cabac_init_idc;
  }
  slice->cabac_init_idc = local_44;
  slice->disable_deblocking_filter_idc = (cfg->codec).field_1.h264.deblock_disable;
  slice->slice_alpha_c0_offset_div2 = (cfg->codec).field_1.h264.deblock_offset_alpha;
  slice->slice_beta_offset_div2 = (cfg->codec).field_1.h264.deblock_offset_beta;
  slice->idr_flag = (uint)uVar2 & 1;
  if (slice->idr_flag != 0) {
    slice->idr_pic_id = slice->next_idr_pic_id;
    slice->next_idr_pic_id = slice->next_idr_pic_id + 1;
    if (0xf < slice->next_idr_pic_id) {
      slice->next_idr_pic_id = 0;
    }
  }
  slice->pic_order_cnt_lsb = frm->poc & (1 << ((byte)slice->log2_max_poc_lsb & 0x1f)) - 1U;
  slice->num_ref_idx_active = 1;
  slice->no_output_of_prior_pics = 0;
  if (slice->idr_flag == 0) {
    slice->long_term_reference_flag = 0;
  }
  else {
    slice->long_term_reference_flag = (uint)((frm->status).val >> 7) & 1;
  }
  return 0;
}

Assistant:

RK_S32 h264e_slice_update(H264eSlice *slice, MppEncCfgSet *cfg,
                          H264eSps *sps, H264ePps *pps, H264eDpbFrm *frm)
{
    MppEncH264Cfg *h264 = &cfg->codec.h264;
    RK_S32 is_idr = frm->status.is_idr;

    slice->mb_w = sps->pic_width_in_mbs;
    slice->mb_h = sps->pic_height_in_mbs;
    slice->max_num_ref_frames = sps->num_ref_frames;
    slice->log2_max_frame_num = sps->log2_max_frame_num_minus4 + 4;
    slice->log2_max_poc_lsb = sps->log2_max_poc_lsb_minus4 + 4;
    slice->entropy_coding_mode = h264->entropy_coding_mode;
    slice->pic_order_cnt_type = sps->pic_order_cnt_type;
    slice->qp_init = pps->pic_init_qp;

    slice->nal_reference_idc = (frm->status.is_non_ref) ? (H264_NALU_PRIORITY_DISPOSABLE) :
                               (is_idr) ? (H264_NALU_PRIORITY_HIGHEST) :
                               (H264_NALU_PRIORITY_HIGH);
    slice->nalu_type = (is_idr) ? (H264_NALU_TYPE_IDR) : (H264_NALU_TYPE_SLICE);

    slice->first_mb_in_slice = 0;
    slice->slice_type = (is_idr) ? (H264_I_SLICE) : (H264_P_SLICE);
    slice->pic_parameter_set_id = 0;
    slice->frame_num = frm->frame_num;
    slice->num_ref_idx_override = 0;
    slice->qp_delta = 0;
    slice->cabac_init_idc = h264->entropy_coding_mode ? h264->cabac_init_idc : -1;
    slice->disable_deblocking_filter_idc = h264->deblock_disable;
    slice->slice_alpha_c0_offset_div2 = h264->deblock_offset_alpha;
    slice->slice_beta_offset_div2 = h264->deblock_offset_beta;

    slice->idr_flag = is_idr;

    if (slice->idr_flag) {
        slice->idr_pic_id = slice->next_idr_pic_id;
        slice->next_idr_pic_id++;
        if (slice->next_idr_pic_id >= 16)
            slice->next_idr_pic_id = 0;
    }

    slice->pic_order_cnt_lsb = frm->poc & ((1 << slice->log2_max_poc_lsb) - 1);
    slice->num_ref_idx_active = 1;
    slice->no_output_of_prior_pics = 0;
    if (slice->idr_flag)
        slice->long_term_reference_flag = frm->status.is_lt_ref;
    else
        slice->long_term_reference_flag = 0;

    return MPP_OK;
}